

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall
AmpIO::WriteWaveformTable(AmpIO *this,quadlet_t *buffer,unsigned_short offset,unsigned_short nquads)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  uint uVar3;
  __uint32_t _Var4;
  int iVar5;
  ushort local_32;
  unsigned_short i;
  nodeaddr_t address;
  unsigned_short nquads_local;
  unsigned_short offset_local;
  quadlet_t *buffer_local;
  AmpIO *this_local;
  
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar2 < 7) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x64524131) {
      this_local._7_1_ = false;
    }
    else if (nquads == 0) {
      this_local._7_1_ = true;
    }
    else {
      uVar3 = (*((this->super_FpgaIO).super_BoardIO.port)->_vptr_BasePort[0x1a])();
      if (uVar3 >> 2 < (uint)nquads) {
        this_local._7_1_ = false;
      }
      else if (offset < 0x400) {
        for (local_32 = 0; local_32 < nquads; local_32 = local_32 + 1) {
          _Var4 = __bswap_32(buffer[local_32] ^ 0xf);
          WriteWaveformTable::localBuffer[local_32] = _Var4;
        }
        pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
        iVar5 = (*pBVar1->_vptr_BasePort[0x27])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                           (long)(int)(offset + 0x8000),WriteWaveformTable::localBuffer,
                           (ulong)nquads << 2);
        this_local._7_1_ = (bool)((byte)iVar5 & 1);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::WriteWaveformTable(const quadlet_t *buffer, unsigned short offset, unsigned short nquads)
{
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() == dRA1_String) return false;

    if (nquads == 0) return true;
    if (nquads > (port->GetMaxWriteDataSize()/sizeof(quadlet_t))) return false;
    if (offset > 1023) return false;
    static quadlet_t localBuffer[MAX_POSSIBLE_DATA_SIZE/sizeof(quadlet_t)];
    nodeaddr_t address = 0x8000 + offset;   // ADDR_WAVEFORM = 0x8000
    // Byteswap and invert digital output bits (see WriteDigitalOutput and GetDigitalOutput)
    for (unsigned short i = 0; i < nquads; i++)
        localBuffer[i] = bswap_32(buffer[i]^0x0000000f);
    return port->WriteBlock(BoardId, address, localBuffer, nquads*sizeof(quadlet_t));
}